

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Vector3f __thiscall pbrt::OctahedralVector::operator_cast_to_Vector3(OctahedralVector *this)

{
  bool bVar1;
  float fVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector3f VVar14;
  
  auVar11 = vpmovzxwd_avx(ZEXT416((uint)*this));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar6._8_4_ = 0x477fff00;
  auVar6._0_8_ = 0x477fff00477fff00;
  auVar6._12_4_ = 0x477fff00;
  auVar6 = vdivps_avx512vl(auVar11,auVar6);
  auVar8._8_4_ = 0x40000000;
  auVar8._0_8_ = 0x4000000040000000;
  auVar8._12_4_ = 0x40000000;
  auVar11._8_4_ = 0xbf800000;
  auVar11._0_8_ = 0xbf800000bf800000;
  auVar11._12_4_ = 0xbf800000;
  auVar7 = vfmadd213ps_avx512vl(auVar8,auVar6,auVar11);
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx512vl(auVar7,auVar4);
  auVar11 = vhaddps_avx(auVar6,auVar6);
  fVar2 = 1.0 - auVar11._0_4_;
  if (fVar2 < 0.0) {
    auVar12._8_4_ = 0x3f800000;
    auVar12._0_8_ = 0x3f8000003f800000;
    auVar12._12_4_ = 0x3f800000;
    auVar11 = vshufps_avx(auVar6,auVar6,0xe1);
    uVar3 = vcmpps_avx512vl(auVar7,ZEXT816(0) << 0x40,1);
    auVar11 = vsubps_avx(auVar12,auVar11);
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(auVar11,auVar5);
    bVar1 = (bool)((byte)uVar3 & 1);
    auVar7._0_4_ = (uint)bVar1 * auVar6._0_4_ | (uint)!bVar1 * auVar11._0_4_;
    bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar7._4_4_ = (uint)bVar1 * auVar6._4_4_ | (uint)!bVar1 * auVar11._4_4_;
    bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar7._8_4_ = (uint)bVar1 * auVar6._8_4_ | (uint)!bVar1 * auVar11._8_4_;
    bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar7._12_4_ = (uint)bVar1 * auVar6._12_4_ | (uint)!bVar1 * auVar11._12_4_;
  }
  auVar10._0_4_ = auVar7._0_4_ * auVar7._0_4_;
  auVar10._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar10._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar10._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar11 = vhaddps_avx(auVar10,auVar10);
  auVar11 = ZEXT416((uint)(fVar2 * fVar2 + auVar11._0_4_));
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  fVar9 = auVar11._0_4_;
  auVar13._4_4_ = fVar9;
  auVar13._0_4_ = fVar9;
  auVar13._8_4_ = fVar9;
  auVar13._12_4_ = fVar9;
  VVar14.super_Tuple3<pbrt::Vector3,_float>.z = fVar2 / fVar9;
  auVar11 = vdivps_avx(auVar7,auVar13);
  VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar11._0_8_;
  return (Vector3f)VVar14.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

operator Vector3f() const {
        Vector3f v;
        v.x = -1 + 2 * (x / 65535.f);
        v.y = -1 + 2 * (y / 65535.f);
        v.z = 1 - (std::abs(v.x) + std::abs(v.y));
        // Reparameterize directions in the $z<0$ portion of the octahedron
        if (v.z < 0) {
            Float xo = v.x;
            v.x = (1 - std::abs(v.y)) * SignNotZero(xo);
            v.y = (1 - std::abs(xo)) * SignNotZero(v.y);
        }

        return Normalize(v);
    }